

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

void __thiscall
vkt::texture::anon_unknown_0::Texture2DMaxLodTestInstance::getReferenceParams
          (Texture2DMaxLodTestInstance *this,ReferenceParams *params,int cellNdx)

{
  params->maxLod =
       *(float *)(texture::(anonymous_namespace)::getMaxLodForCell(int)::s_values +
                 (long)(cellNdx % 0x11) * 4);
  return;
}

Assistant:

float getMaxLodForCell (int cellNdx)
{
	static const float s_values[] =
	{
		0.0f,
		0.2f,
		0.7f,
		0.4f,
		1.3f,
		0.0f,
		0.5f,
		1.2f,
		-2.0f,
		1.0f,
		0.1f,
		0.3f,
		2.7f,
		1.2f,
		10.0f,
		-1000.f,
		1e10f
	};
	return s_values[cellNdx % DE_LENGTH_OF_ARRAY(s_values)];
}